

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O1

Instruction * __thiscall
spvtools::opt::analysis::DebugInfoManager::GetDebugInfoNone(DebugInfoManager *this)

{
  IRContext *pIVar1;
  uint32_t res_id;
  uint32_t ty_id;
  PodType PVar2;
  pointer pOVar3;
  Instruction *pIVar4;
  SmallVector<unsigned_int,_2UL> *this_00;
  long lVar5;
  Operand *__cur;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_01;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  dbg_info_none_inst;
  size_type __dnew;
  string message;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_120;
  IRContext *local_118;
  Instruction *local_110;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_108;
  undefined1 local_e8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_c8;
  undefined1 local_b8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_98;
  size_t *local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  undefined1 local_58 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_38;
  
  pIVar4 = this->debug_info_none_inst_;
  if (pIVar4 == (Instruction *)0x0) {
    pIVar1 = this->context_;
    res_id = Module::TakeNextIdBound
                       ((pIVar1->module_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                        .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
    if ((res_id == 0) && ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)
       ) {
      local_e8._0_8_ = (_func_int **)0x25;
      local_90 = &local_88.size_;
      local_90 = (size_t *)std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)local_e8);
      local_88.size_ = local_e8._0_8_;
      *local_90 = 0x667265766f204449;
      local_90[1] = 0x797254202e776f6c;
      local_90[2] = 0x676e696e6e757220;
      local_90[3] = 0x746361706d6f6320;
      builtin_strncpy((char *)((long)local_90 + 0x1d),"act-ids.",8);
      local_88._vptr_SmallVector = (_func_int **)local_e8._0_8_;
      *(char *)((long)local_90 + local_e8._0_8_) = '\0';
      local_e8._0_8_ = (_func_int **)0x0;
      local_e8._8_8_ = 0;
      local_e8._16_4_ = (array<signed_char,_4UL>)0x0;
      local_e8._20_4_ = (array<signed_char,_4UL>)0x0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_e8,(char *)local_90);
      if (local_90 != &local_88.size_) {
        operator_delete(local_90,local_88.size_ + 1);
      }
    }
    local_110 = (Instruction *)operator_new(0x70);
    local_118 = this->context_;
    if ((local_118->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(local_118);
    }
    ty_id = TypeManager::GetVoidTypeId
                      ((local_118->type_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                       _M_head_impl);
    PVar2.data._M_elems = (array<signed_char,_4UL>)GetDbgSetImportId(this);
    local_e8._24_8_ = local_e8 + 0x10;
    local_e8._0_8_ = &PTR__SmallVector_009488e0;
    local_c8._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_e8._16_4_ = PVar2.data._M_elems;
    local_e8._8_8_ = 1;
    this_00 = &local_88;
    local_90 = (size_t *)CONCAT44(local_90._4_4_,1);
    local_88._vptr_SmallVector = (_func_int **)&PTR__SmallVector_009488e0;
    local_88.size_ = 0;
    local_88.small_data_ = (uint *)local_88.buffer;
    local_88.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (this_00,(SmallVector<unsigned_int,_2UL> *)local_e8);
    local_b8._24_8_ = local_b8 + 0x10;
    local_b8._0_8_ = &PTR__SmallVector_009488e0;
    local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8._8_8_ = 1;
    local_60 = 7;
    local_58._0_8_ = &PTR__SmallVector_009488e0;
    local_58._8_8_ = 0;
    local_58._24_8_ = local_58 + 0x10;
    local_38._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_58,(SmallVector<unsigned_int,_2UL> *)local_b8
              );
    local_108.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar5 = 0x60;
    pOVar3 = (pointer)operator_new(0x60);
    local_108.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar3 + 2;
    local_108.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = pOVar3;
    do {
      pOVar3->type = *(spv_operand_type_t *)
                      &this_00[-1].large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
      (pOVar3->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_009488e0;
      (pOVar3->words).size_ = 0;
      (pOVar3->words).small_data_ = (uint *)(pOVar3->words).buffer;
      (pOVar3->words).large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar3->words,this_00);
      local_120._M_head_impl = local_110;
      pOVar3 = pOVar3 + 1;
      this_00 = (SmallVector<unsigned_int,_2UL> *)&this_00[1].size_;
      lVar5 = lVar5 + -0x30;
    } while (lVar5 != 0);
    local_108.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = pOVar3;
    Instruction::Instruction(local_110,local_118,OpExtInst,ty_id,res_id,&local_108);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              (&local_108);
    lVar5 = -0x60;
    this_01 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_38
    ;
    do {
      *(undefined ***)(this_01 + -0x20) = &PTR__SmallVector_009488e0;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (this_01,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01);
      }
      *(undefined8 *)this_01 = 0;
      this_01 = this_01 + -0x30;
      lVar5 = lVar5 + 0x30;
    } while (lVar5 != 0);
    local_b8._0_8_ = &PTR__SmallVector_009488e0;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_98,local_98._M_head_impl);
    }
    local_e8._0_8_ = &PTR__SmallVector_009488e0;
    if (local_c8._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_c8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_c8._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    pIVar4 = Instruction::InsertBefore
                       ((((this->context_->module_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                          .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                        ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.
                        sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_,
                        (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         *)&local_120);
    this->debug_info_none_inst_ = pIVar4;
    RegisterDbgInst(this,pIVar4);
    if ((this->context_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      DefUseManager::AnalyzeInstDefUse
                ((this->context_->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,this->debug_info_none_inst_);
    }
    pIVar4 = this->debug_info_none_inst_;
    if (local_120._M_head_impl != (Instruction *)0x0) {
      (*((local_120._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
  }
  return pIVar4;
}

Assistant:

Instruction* DebugInfoManager::GetDebugInfoNone() {
  if (debug_info_none_inst_ != nullptr) return debug_info_none_inst_;

  uint32_t result_id = context()->TakeNextId();
  std::unique_ptr<Instruction> dbg_info_none_inst(new Instruction(
      context(), spv::Op::OpExtInst, context()->get_type_mgr()->GetVoidTypeId(),
      result_id,
      {
          {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {GetDbgSetImportId()}},
          {spv_operand_type_t::SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
           {static_cast<uint32_t>(CommonDebugInfoDebugInfoNone)}},
      }));

  // Add to the front of |ext_inst_debuginfo_|.
  debug_info_none_inst_ =
      context()->module()->ext_inst_debuginfo_begin()->InsertBefore(
          std::move(dbg_info_none_inst));

  RegisterDbgInst(debug_info_none_inst_);
  if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(debug_info_none_inst_);
  return debug_info_none_inst_;
}